

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall
kj::Vector<capnp::compiler::CompilerMain::SourceFile>::setCapacity
          (Vector<capnp::compiler::CompilerMain::SourceFile> *this,size_t newSize)

{
  SourceFile *pSVar1;
  SourceFile *pSVar2;
  RemoveConst<capnp::compiler::CompilerMain::SourceFile> *pRVar3;
  ulong uVar4;
  ArrayBuilder<capnp::compiler::CompilerMain::SourceFile> local_48;
  
  pSVar1 = (this->builder).ptr;
  uVar4 = ((long)(this->builder).pos - (long)pSVar1 >> 3) * 0x6db6db6db6db6db7;
  if (newSize <= uVar4 && uVar4 - newSize != 0) {
    (this->builder).pos = pSVar1 + newSize;
  }
  local_48.pos = (RemoveConst<capnp::compiler::CompilerMain::SourceFile> *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (0x38,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_48.endPtr = local_48.pos + newSize;
  local_48.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pSVar1 = (this->builder).ptr;
  pSVar2 = (this->builder).pos;
  local_48.ptr = local_48.pos;
  if (pSVar1 != pSVar2) {
    uVar4 = (ulong)((long)pSVar2 + (-0x38 - (long)pSVar1)) / 0x38;
    memcpy(local_48.pos,pSVar1,uVar4 * 0x38 + 0x38);
    local_48.pos = local_48.pos + uVar4 + 1;
  }
  ArrayBuilder<capnp::compiler::CompilerMain::SourceFile>::operator=(&this->builder,&local_48);
  pSVar2 = local_48.endPtr;
  pRVar3 = local_48.pos;
  pSVar1 = local_48.ptr;
  if (local_48.ptr != (SourceFile *)0x0) {
    local_48.ptr = (SourceFile *)0x0;
    local_48.pos = (RemoveConst<capnp::compiler::CompilerMain::SourceFile> *)0x0;
    local_48.endPtr = (SourceFile *)0x0;
    (**(local_48.disposer)->_vptr_ArrayDisposer)
              (local_48.disposer,pSVar1,0x38,((long)pRVar3 - (long)pSVar1 >> 3) * 0x6db6db6db6db6db7
               ,((long)pSVar2 - (long)pSVar1 >> 3) * 0x6db6db6db6db6db7,0);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }